

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O2

void py_attack(player *p,loc grid)

{
  wchar_t *pwVar1;
  bitflag *flags;
  ushort uVar2;
  short sVar3;
  wchar_t wVar4;
  uint uVar5;
  monster_conflict *pmVar6;
  _Bool _Var7;
  int16_t iVar8;
  wchar_t wVar9;
  uint32_t uVar10;
  int iVar11;
  object *poVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  sbyte sVar16;
  int iVar17;
  ulong uVar18;
  _Bool fear;
  monster_conflict *local_50;
  object *local_48;
  object *local_40;
  int local_34;
  
  uVar2 = z_info->move_energy;
  uVar5 = (int)p->energy;
  if ((int)(uint)uVar2 <= (int)p->energy) {
    uVar5 = (uint)uVar2;
  }
  wVar4 = (p->state).num_blows;
  fear = false;
  local_50 = (monster_conflict *)square_monster(cave,grid);
  disturb(p);
  p->upkeep->energy_use = L'\0';
  flags = (p->state).pflags;
  _Var7 = flag_has_dbg(flags,3,0x11,"p->state.pflags","(PF_COMBAT_REGEN)");
  if (_Var7) {
    uVar15 = 0x8000;
    if (9 < p->msp) {
      uVar15 = (uint)((int)p->msp << 0xe) / 5;
    }
    player_adjust_mana_precise(p,uVar15);
  }
  _Var7 = flag_has_dbg(flags,3,0xf,"p->state.pflags","(PF_SHIELD_BASH)");
  if ((_Var7) && (_Var7 = monster_is_visible((monster *)local_50), _Var7)) {
    wVar9 = slot_by_name(p,"weapon");
    local_48 = slot_object(p,wVar9);
    wVar9 = slot_by_name(p,"arm");
    poVar12 = slot_object(p,wVar9);
    iVar11 = (p->state).skills[6];
    iVar17 = adj_dex_th[(p->state).stat_ind[3]];
    sVar16 = 2;
    if ((poVar12 != (object *)0x0) && ((int)(p->lev / 2) <= local_50->race->level)) {
      local_40 = poVar12;
      local_34 = (p->state).num_blows / 100;
      poVar12 = equipped_item_by_slot_name(p,"weapon");
      if (poVar12 != (object *)0x0) {
        iVar14 = local_34 * (uint)local_48->ds * (uint)local_48->dd;
        iVar13 = (uint)local_40->ds * (uint)local_40->dd;
        sVar16 = SBORROW4(iVar14,iVar13 * 3) != iVar14 + iVar13 * -3 < 0;
      }
      uVar10 = Rand_div(local_50->race->level + L'È');
      if ((int)uVar10 < iVar17 / 2 + iVar11 / 8 << sVar16) {
        iVar11 = (p->state).skills[6];
        sVar3 = p->wt;
        local_48._0_4_ = p->upkeep->total_weight / 0x50;
        iVar8 = object_weight_one(local_40);
        iVar17 = (int)(iVar8 / 2) + (int)(sVar3 / 8) + iVar11 / 4 + (int)local_48;
        iVar11 = damroll((uint)local_40->dd,(uint)local_40->ds);
        local_48 = (object *)CONCAT44(local_48._4_4_,iVar17);
        iVar11 = ((int)(p->lev / 0xe) + iVar17 / 0x28) * iVar11;
        uVar15 = iVar11 + adj_str_td[(p->state).stat_ind[0]];
        if (uVar15 != 0 && SCARRY4(iVar11,adj_str_td[(p->state).stat_ind[0]]) == (int)uVar15 < 0) {
          uVar18 = 0x7d;
          if (uVar15 < 0x7d) {
            uVar18 = (ulong)uVar15;
          }
          if ((p->opts).opt[3] == true) {
            msgt(2,"You get in a shield bash! (%d)",uVar18);
          }
          else {
            msgt(2,"You get in a shield bash!");
          }
          pmVar6 = local_50;
          uVar10 = Rand_div((wchar_t)uVar18);
          local_40 = (object *)CONCAT44(local_40._4_4_,uVar10);
          uVar10 = Rand_div((uint32_t)(uVar18 >> 1));
          if ((int)(uVar10 + 0x1f) <= (int)local_40) {
            msgt(0x91,"WHAMM!");
          }
          _Var7 = mon_take_hit(pmVar6,p,(wchar_t)uVar18,&fear,(char *)0x0);
          if (_Var7) {
            return;
          }
          iVar11 = p->lev + (int)local_48;
          uVar10 = Rand_div(local_50->race->level * 8 + 200);
          pmVar6 = local_50;
          if ((int)(uVar10 + 1) < iVar11) {
            uVar10 = Rand_div((int)(p->lev / 5));
            mon_inc_timed((monster *)pmVar6,L'\x01',uVar10 + L'\x04',L'\0');
          }
          iVar11 = (int)local_48 + p->lev;
          uVar10 = Rand_div(pmVar6->race->level * 0xc + 300);
          if ((int)(uVar10 + 1) < iVar11) {
            uVar10 = Rand_div((int)(p->lev / 5));
            mon_inc_timed((monster *)pmVar6,L'\x02',uVar10 + L'\x04',L'\0');
          }
          iVar11 = adj_dex_th[(p->state).stat_ind[3]];
          uVar10 = Rand_div(0x3c);
          if (iVar11 + 0x23 <= (int)uVar10) {
            uVar10 = Rand_div(0x32);
            msgt(0,"You stumble!");
            pwVar1 = &p->upkeep->energy_use;
            *pwVar1 = *pwVar1 + (int)((uint)z_info->move_energy * (uVar10 + 0x1a)) / 100;
          }
        }
      }
    }
  }
  wVar9 = p->upkeep->energy_use;
  _Var7 = false;
  while ((pmVar6 = local_50, iVar11 = (int)((long)(ulong)((uint)uVar2 * 100) / (long)wVar4),
         iVar11 <= uVar5 - wVar9 && (_Var7 == false))) {
    _Var7 = py_attack_real(p,grid,&fear);
    wVar9 = p->upkeep->energy_use + iVar11;
    p->upkeep->energy_use = wVar9;
  }
  if ((fear == true) && (_Var7 = monster_is_visible((monster *)local_50), _Var7)) {
    add_monster_message(pmVar6,L'#',true);
  }
  return;
}

Assistant:

void py_attack(struct player *p, struct loc grid)
{
	int avail_energy = MIN(p->energy, z_info->move_energy);
	int blow_energy = 100 * z_info->move_energy / p->state.num_blows;
	bool slain = false, fear = false;
	struct monster *mon = square_monster(cave, grid);

	/* Disturb the player */
	disturb(p);

	/* Initialize the energy used */
	p->upkeep->energy_use = 0;

	/* Reward BGs with 5% of max SPs, min 1/2 point */
	if (player_has(p, PF_COMBAT_REGEN)) {
		int32_t sp_gain = (((int32_t)MAX(p->msp, 10)) * 16384) / 5;
		player_adjust_mana_precise(p, sp_gain);
	}

	/* Player attempts a shield bash if they can, and if monster is visible
	 * and not too pathetic */
	if (player_has(p, PF_SHIELD_BASH) && monster_is_visible(mon)) {
		/* Monster may die */
		if (attempt_shield_bash(p, mon, &fear)) return;
	}

	/* Attack until the next attack would exceed energy available or
	 * a full turn or until the enemy dies. We limit energy use
	 * to avoid giving monsters a possible double move. */
	while (avail_energy - p->upkeep->energy_use >= blow_energy && !slain) {
		slain = py_attack_real(p, grid, &fear);
		p->upkeep->energy_use += blow_energy;
	}

	/* Hack - delay fear messages */
	if (fear && monster_is_visible(mon)) {
		add_monster_message(mon, MON_MSG_FLEE_IN_TERROR, true);
	}
}